

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createQuadPlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  QuadMeshNode *this_00;
  Vec3fa *pVVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  size_t sVar20;
  size_t sVar21;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *this_01;
  float fVar22;
  float fVar23;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  Node *local_50;
  ulong local_48;
  Vec3fa *local_40;
  long local_38;
  
  local_50 = (Node *)this;
  this_00 = (QuadMeshNode *)operator_new(0xd8);
  local_58 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  QuadMeshNode::QuadMeshNode(this_00,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar14 = width + 1;
  local_38 = height + 1;
  uVar15 = local_38 * lVar14;
  uVar16 = pvVar3->size_alloced;
  uVar19 = uVar16;
  if ((uVar16 < uVar15) && (uVar19 = uVar15, uVar16 != 0)) {
    while (uVar19 = uVar16, uVar19 < uVar15) {
      uVar16 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0);
    }
  }
  if (uVar15 < pvVar3->size_active) {
    pvVar3->size_active = uVar15;
  }
  if (pvVar3->size_alloced == uVar19) {
    pvVar3->size_active = uVar15;
  }
  else {
    local_40 = pvVar3->items;
    local_48 = uVar19;
    pVVar12 = (Vec3fa *)alignedMalloc(uVar19 << 4,0x10);
    pvVar3->items = pVVar12;
    if (pvVar3->size_active != 0) {
      lVar13 = 0;
      uVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)&local_40->field_0 + lVar13);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        uVar16 = uVar16 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar16 < pvVar3->size_active);
    }
    alignedFree(local_40);
    pvVar3->size_active = uVar15;
    pvVar3->size_alloced = local_48;
  }
  this_01 = &this_00->quads;
  std::
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ::resize(this_01,height * width);
  lVar13 = 0;
  uVar16 = 0;
  do {
    fVar22 = (float)uVar16 / (float)height;
    uVar19 = 0;
    lVar17 = lVar13;
    do {
      fVar23 = (float)uVar19 / (float)width;
      fVar5 = (dx->field_0).m128[1];
      fVar6 = (dx->field_0).m128[2];
      fVar7 = (p0->field_0).m128[1];
      fVar8 = (p0->field_0).m128[2];
      fVar9 = (dy->field_0).m128[1];
      fVar10 = (dy->field_0).m128[2];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17) =
           (dy->field_0).m128[0] * fVar22 + fVar23 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17 + 4) =
           fVar9 * fVar22 + fVar23 * fVar5 + fVar7;
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17 + 8) =
           fVar10 * fVar22 + fVar23 * fVar6 + fVar8;
      uVar19 = uVar19 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar14 + (ulong)(lVar14 == 0) != uVar19);
    uVar16 = uVar16 + 1;
    lVar13 = lVar13 + width * 0x10 + 0x10;
  } while (uVar16 != local_38 + (ulong)(local_38 == 0));
  if (height != 0) {
    uVar16 = (ulong)((int)width + 1);
    lVar14 = 0;
    lVar13 = 0;
    sVar20 = 0;
    sVar18 = width;
    do {
      if (width != 0) {
        sVar21 = 0;
        lVar17 = lVar14;
        do {
          iVar4 = (int)sVar21;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v0 + lVar17) =
               (int)lVar13 + iVar4;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v1 + lVar17) =
               (int)lVar13 + iVar4 + 1;
          sVar21 = sVar21 + 1;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v2 + lVar17) =
               (int)sVar18 + 2 + iVar4;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v3 + lVar17) =
               (int)sVar18 + 1 + iVar4;
          lVar17 = lVar17 + 0x10;
        } while (width != sVar21);
      }
      sVar20 = sVar20 + 1;
      sVar18 = sVar18 + uVar16;
      lVar13 = lVar13 + uVar16;
      lVar14 = lVar14 + width * 0x10;
    } while (sVar20 != height);
  }
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_50;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createQuadPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->quads.resize(width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = y*width+x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->quads[i].v0 = unsigned(p00); 
        mesh->quads[i].v1 = unsigned(p01); 
        mesh->quads[i].v2 = unsigned(p11); 
        mesh->quads[i].v3 = unsigned(p10);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }